

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

LY_ERR lys_find_expr_atoms(lysc_node *ctx_node,lys_module *cur_mod,lyxp_expr *expr,
                          lysc_prefix *prefixes,uint32_t options,ly_set **set)

{
  lyd_node **pplVar1;
  ly_ctx *local_f0;
  ly_ctx *local_e8;
  uint local_dc;
  undefined1 local_d8 [4];
  uint32_t i;
  lyxp_set xp_set;
  LY_ERR ret;
  ly_set **set_local;
  uint32_t options_local;
  lysc_prefix *prefixes_local;
  lyxp_expr *expr_local;
  lys_module *cur_mod_local;
  lysc_node *ctx_node_local;
  
  xp_set._140_4_ = 0;
  memset(local_d8,0,0x90);
  if (cur_mod == (lys_module *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","cur_mod",
           "lys_find_expr_atoms");
    ctx_node_local._4_4_ = LY_EINVAL;
  }
  else if (expr == (lyxp_expr *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","expr",
           "lys_find_expr_atoms");
    ctx_node_local._4_4_ = LY_EINVAL;
  }
  else if (prefixes == (lysc_prefix *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","prefixes",
           "lys_find_expr_atoms");
    ctx_node_local._4_4_ = LY_EINVAL;
  }
  else if (set == (ly_set **)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","set",
           "lys_find_expr_atoms");
    ctx_node_local._4_4_ = LY_EINVAL;
  }
  else {
    if (((ctx_node != (lysc_node *)0x0) && (ctx_node->module->ctx != (ly_ctx *)0x0)) &&
       (cur_mod->ctx != (ly_ctx *)0x0)) {
      if (ctx_node == (lysc_node *)0x0) {
        local_e8 = (ly_ctx *)0x0;
      }
      else {
        local_e8 = ctx_node->module->ctx;
      }
      if (local_e8 != cur_mod->ctx) {
        if (ctx_node == (lysc_node *)0x0) {
          local_f0 = (ly_ctx *)0x0;
        }
        else {
          local_f0 = ctx_node->module->ctx;
        }
        ly_log(local_f0,LY_LLERR,LY_EINVAL,"Different contexts mixed in a single function call.");
        return LY_EINVAL;
      }
    }
    set_local._4_4_ = options;
    if ((options & 0x1c) == 0) {
      set_local._4_4_ = 4;
    }
    xp_set._140_4_ = ly_set_new(set);
    if ((xp_set._140_4_ == LY_SUCCESS) &&
       (xp_set._140_4_ =
             lyxp_atomize(cur_mod->ctx,expr,cur_mod,LY_VALUE_SCHEMA_RESOLVED,prefixes,ctx_node,
                          ctx_node,(lyxp_set *)local_d8,set_local._4_4_),
       xp_set._140_4_ == LY_SUCCESS)) {
      pplVar1 = (lyd_node **)malloc((ulong)(uint)xp_set.val._8_4_ << 3);
      ((*set)->field_2).dnodes = pplVar1;
      if (((*set)->field_2).dnodes == (lyd_node **)0x0) {
        ly_log(cur_mod->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
               "lys_find_expr_atoms");
        xp_set._140_4_ = 1;
      }
      else {
        (*set)->size = xp_set.val._8_4_;
        for (local_dc = 0; local_dc < (uint)xp_set.val._8_4_; local_dc = local_dc + 1) {
          if ((*(int *)(xp_set._8_8_ + (ulong)local_dc * 0x18 + 8) == 3) &&
             (-1 < *(int *)(xp_set._8_8_ + (ulong)local_dc * 0x18 + 0xc))) {
            if ((*(int *)(xp_set._8_8_ + (ulong)local_dc * 0x18 + 0xc) != 0) &&
               ((*(int *)(xp_set._8_8_ + (ulong)local_dc * 0x18 + 0xc) != 1 &&
                (*(int *)(xp_set._8_8_ + (ulong)local_dc * 0x18 + 0xc) != 2)))) {
              __assert_fail("(xp_set.val.scnodes[i].in_ctx == LYXP_SET_SCNODE_ATOM_NODE) || (xp_set.val.scnodes[i].in_ctx == LYXP_SET_SCNODE_ATOM_VAL) || (xp_set.val.scnodes[i].in_ctx == LYXP_SET_SCNODE_ATOM_CTX)"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_schema.c"
                            ,0x208,
                            "LY_ERR lys_find_expr_atoms(const struct lysc_node *, const struct lys_module *, const struct lyxp_expr *, const struct lysc_prefix *, uint32_t, struct ly_set **)"
                           );
            }
            xp_set._140_4_ =
                 ly_set_add(*set,*(void **)(xp_set._8_8_ + (ulong)local_dc * 0x18),'\x01',
                            (uint32_t *)0x0);
            if (xp_set._140_4_ != LY_SUCCESS) break;
          }
        }
      }
    }
    lyxp_set_free_content((lyxp_set *)local_d8);
    if (xp_set._140_4_ != 0) {
      ly_set_free(*set,(_func_void_void_ptr *)0x0);
      *set = (ly_set *)0x0;
    }
    ctx_node_local._4_4_ = xp_set._140_4_;
  }
  return ctx_node_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lys_find_expr_atoms(const struct lysc_node *ctx_node, const struct lys_module *cur_mod, const struct lyxp_expr *expr,
        const struct lysc_prefix *prefixes, uint32_t options, struct ly_set **set)
{
    LY_ERR ret = LY_SUCCESS;
    struct lyxp_set xp_set = {0};
    uint32_t i;

    LY_CHECK_ARG_RET(NULL, cur_mod, expr, prefixes, set, LY_EINVAL);
    LY_CHECK_CTX_EQUAL_RET(ctx_node ? ctx_node->module->ctx : NULL, cur_mod->ctx, LY_EINVAL);
    if (!(options & LYXP_SCNODE_ALL)) {
        options = LYXP_SCNODE;
    }

    /* allocate return set */
    ret = ly_set_new(set);
    LY_CHECK_GOTO(ret, cleanup);

    /* atomize expression */
    ret = lyxp_atomize(cur_mod->ctx, expr, cur_mod, LY_VALUE_SCHEMA_RESOLVED, (void *)prefixes, ctx_node, ctx_node,
            &xp_set, options);
    LY_CHECK_GOTO(ret, cleanup);

    /* transform into ly_set */
    (*set)->objs = malloc(xp_set.used * sizeof *(*set)->objs);
    LY_CHECK_ERR_GOTO(!(*set)->objs, LOGMEM(cur_mod->ctx); ret = LY_EMEM, cleanup);
    (*set)->size = xp_set.used;

    for (i = 0; i < xp_set.used; ++i) {
        if ((xp_set.val.scnodes[i].type == LYXP_NODE_ELEM) && (xp_set.val.scnodes[i].in_ctx >= LYXP_SET_SCNODE_ATOM_NODE)) {
            assert((xp_set.val.scnodes[i].in_ctx == LYXP_SET_SCNODE_ATOM_NODE) ||
                    (xp_set.val.scnodes[i].in_ctx == LYXP_SET_SCNODE_ATOM_VAL) ||
                    (xp_set.val.scnodes[i].in_ctx == LYXP_SET_SCNODE_ATOM_CTX));
            ret = ly_set_add(*set, xp_set.val.scnodes[i].scnode, 1, NULL);
            LY_CHECK_GOTO(ret, cleanup);
        }
    }

cleanup:
    lyxp_set_free_content(&xp_set);
    if (ret) {
        ly_set_free(*set, NULL);
        *set = NULL;
    }
    return ret;
}